

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O2

BasicStringView<char> __thiscall
Corrade::Containers::BasicStringView<char>::findLastOr
          (BasicStringView<char> *this,char character,char *fail)

{
  char *begin;
  BasicStringView<char> BVar1;
  
  begin = Implementation::stringFindLastCharacter
                    (this->_data,this->_sizePlusFlags & 0x3fffffffffffffff,character);
  if (begin == (char *)0x0) {
    BVar1._sizePlusFlags = 0;
    BVar1._data = fail;
  }
  else {
    BVar1 = slice(this,begin,begin + 1);
  }
  return BVar1;
}

Assistant:

inline BasicStringView<T> BasicStringView<T>::findLastOr(const char character, T* const fail) const {
    if(const char* const found = Implementation::stringFindLastCharacter(_data, size(), character))
        return slice(const_cast<T*>(found), const_cast<T*>(found + 1));

    /* Using an internal assert-less constructor, the public constructor
       asserts would be redundant. Since it's a zero-sized view, it doesn't
       really make sense to try to preserve any flags. */
    return BasicStringView<T>{fail, 0 /* empty, no flags */, nullptr};
}